

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkGetDky(ARKodeMem ark_mem,realtype t,int k,N_Vector dky)

{
  double dVar1;
  double dVar2;
  int error_code;
  char *msgfmt;
  double dVar3;
  
  if (ark_mem == (ARKodeMem)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    ark_mem = (ARKodeMem)0x0;
  }
  else {
    if (dky == (N_Vector)0x0) {
      msgfmt = "dky = NULL illegal.";
      error_code = -0x1a;
      goto LAB_004fb9c8;
    }
    if (ark_mem->interp != (ARKInterp)0x0) {
      dVar1 = ark_mem->tcur;
      dVar2 = ark_mem->hold;
      dVar3 = (ABS(dVar2) + ABS(dVar1)) * ark_mem->uround * 100.0;
      dVar3 = (double)(-(ulong)(dVar2 < 0.0) & (ulong)-dVar3 | ~-(ulong)(dVar2 < 0.0) & (ulong)dVar3
                      );
      if (0.0 < (t - (dVar3 + dVar1)) * (t - ((dVar1 - dVar2) - dVar3))) {
        arkProcessError(ark_mem,-0x19,"ARKode","arkGetDky",
                        "Illegal value for t.t = %lg is not between tcur - hold = %lg and tcur = %lg."
                       );
        return -0x19;
      }
      error_code = arkInterpEvaluate(ark_mem,ark_mem->interp,(t - dVar1) / ark_mem->h,k,5,dky);
      if (error_code == 0) {
        return 0;
      }
      msgfmt = "Error calling arkInterpEvaluate";
      goto LAB_004fb9c8;
    }
    msgfmt = "Missing interpolation structure";
  }
  error_code = -0x15;
LAB_004fb9c8:
  arkProcessError(ark_mem,error_code,"ARKode","arkGetDky",msgfmt);
  return error_code;
}

Assistant:

int arkGetDky(ARKodeMem ark_mem, realtype t, int k, N_Vector dky)
{
  realtype s, tfuzz, tp, tn1;
  int retval;

  /* Check all inputs for legality */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode", "arkGetDky",
                    MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  if (dky == NULL) {
    arkProcessError(ark_mem, ARK_BAD_DKY, "ARKode", "arkGetDky",
                    MSG_ARK_NULL_DKY);
    return(ARK_BAD_DKY);
  }
  if (ark_mem->interp == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode", "arkGetDky",
                    "Missing interpolation structure");
    return(ARK_MEM_NULL);
  }


  /* Allow for some slack */
  tfuzz = FUZZ_FACTOR * ark_mem->uround *
    (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->hold));
  if (ark_mem->hold < ZERO) tfuzz = -tfuzz;
  tp = ark_mem->tcur - ark_mem->hold - tfuzz;
  tn1 = ark_mem->tcur + tfuzz;
  if ((t-tp)*(t-tn1) > ZERO) {
    arkProcessError(ark_mem, ARK_BAD_T, "ARKode", "arkGetDky",
                    MSG_ARK_BAD_T, t, ark_mem->tcur-ark_mem->hold,
                    ark_mem->tcur);
    return(ARK_BAD_T);
  }

  /* call arkInterpEvaluate to evaluate result */
  s = (t - ark_mem->tcur) / ark_mem->h;
  retval = arkInterpEvaluate(ark_mem, ark_mem->interp, s,
                             k, ARK_INTERP_MAX_DEGREE, dky);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode", "arkGetDky",
                    "Error calling arkInterpEvaluate");
    return(retval);
  }
  return(ARK_SUCCESS);
}